

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_modVecScalar_ivec4(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  long lVar2;
  int i_1;
  Vector<float,_4> res_2;
  undefined8 local_38;
  float local_30;
  float local_2c;
  Vector<int,_4> res;
  Vector<int,_4> res_1;
  
  local_38 = *(undefined8 *)(c->in[0].m_data + 1);
  local_30 = c->in[0].m_data[3];
  local_2c = c->in[0].m_data[0];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = (int)*(float *)((long)&local_38 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  fVar1 = c->in[1].m_data[0];
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = (float)(int)fVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = res.m_data[lVar2] % (int)res_2.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = (float)res_1.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)(c->color).m_data = res_2.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = res_2.m_data._8_8_;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }